

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

BinaryConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::BinaryConditionalDirectiveExpressionSyntax_const&>
          (BumpAllocator *this,BinaryConditionalDirectiveExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ConditionalDirectiveExpressionSyntax *pCVar3;
  Info *pIVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  BinaryConditionalDirectiveExpressionSyntax *pBVar10;
  
  pBVar10 = (BinaryConditionalDirectiveExpressionSyntax *)allocate(this,0x38,8);
  uVar5 = *(undefined4 *)
           &(args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode;
  pCVar3 = (args->left).ptr;
  TVar6 = (args->op).kind;
  uVar7 = (args->op).field_0x2;
  NVar8.raw = (args->op).numFlags.raw;
  uVar9 = (args->op).rawLen;
  pIVar4 = (args->op).info;
  (pBVar10->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind =
       (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pBVar10->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4 =
       uVar5;
  (pBVar10->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  (pBVar10->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pBVar10->left).ptr = pCVar3;
  (pBVar10->op).kind = TVar6;
  (pBVar10->op).field_0x2 = uVar7;
  (pBVar10->op).numFlags = (NumericTokenFlags)NVar8.raw;
  (pBVar10->op).rawLen = uVar9;
  (pBVar10->op).info = pIVar4;
  (pBVar10->right).ptr = (args->right).ptr;
  return pBVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }